

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O1

int32_t icu_63::PropNameData::getPropertyOrValueEnum(int32_t bytesTrieOffset,char *alias)

{
  UBool UVar1;
  int32_t iVar2;
  BytesTrie trie;
  BytesTrie local_28;
  
  local_28.bytes_ = &bytesTries + bytesTrieOffset;
  local_28.ownedArray_ = (uint8_t *)0x0;
  local_28.remainingMatchLength_ = -1;
  local_28.pos_ = local_28.bytes_;
  UVar1 = containsName(&local_28,alias);
  if (UVar1 == '\0') {
    iVar2 = -1;
  }
  else {
    iVar2 = BytesTrie::readValue(local_28.pos_ + 1,(uint)(*local_28.pos_ >> 1));
  }
  BytesTrie::~BytesTrie(&local_28);
  return iVar2;
}

Assistant:

int32_t PropNameData::getPropertyOrValueEnum(int32_t bytesTrieOffset, const char *alias) {
    BytesTrie trie(bytesTries+bytesTrieOffset);
    if(containsName(trie, alias)) {
        return trie.getValue();
    } else {
        return UCHAR_INVALID_CODE;
    }
}